

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O2

void jsonReturnParse(sqlite3_context *ctx,JsonParse *p)

{
  byte *pbVar1;
  Mem *pMVar2;
  long in_FS_OFFSET;
  undefined1 local_a8 [48];
  undefined1 *local_78;
  undefined1 *puStack_70;
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  undefined1 *puStack_50;
  undefined1 *local_48;
  undefined1 *puStack_40;
  undefined1 *local_38;
  undefined1 *puStack_30;
  undefined1 *local_28;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  if (p->oom == '\0') {
    if (((ulong)ctx->pFunc->pUserData & 8) == 0) {
      local_a8._8_8_ = local_a8 + 0x22;
      local_a8._40_8_ = &DAT_aaaaaaaaaaaaaaaa;
      local_28 = &DAT_aaaaaaaaaaaaaaaa;
      local_38 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_30 = &DAT_aaaaaaaaaaaaaaaa;
      local_48 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_40 = &DAT_aaaaaaaaaaaaaaaa;
      local_58 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_50 = &DAT_aaaaaaaaaaaaaaaa;
      local_68 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
      local_78 = &DAT_aaaaaaaaaaaaaaaa;
      puStack_70 = &DAT_aaaaaaaaaaaaaaaa;
      local_a8._16_8_ = 100;
      local_a8._24_8_ = 0;
      local_a8[0x20] = '\x01';
      local_a8[0x21] = '\0';
      local_a8[0x22] = -0x56;
      local_a8[0x23] = -0x56;
      local_a8[0x24] = -0x56;
      local_a8[0x25] = -0x56;
      local_a8[0x26] = -0x56;
      local_a8[0x27] = -0x56;
      p->delta = 0;
      local_a8._0_8_ = ctx;
      jsonTranslateBlobToText(p,0,(JsonString *)local_a8);
      jsonReturnString((JsonString *)local_a8,p,ctx);
      pMVar2 = ctx->pOut;
      pMVar2->eSubtype = 'J';
      pbVar1 = (byte *)((long)&pMVar2->flags + 1);
      *pbVar1 = *pbVar1 | 8;
    }
    else {
      if ((p->nBlobAlloc == 0) || (p->bReadOnly != '\0')) {
        if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
          sqlite3_result_blob(ctx,p->aBlob,p->nBlob,(_func_void_void_ptr *)0xffffffffffffffff);
          return;
        }
        goto LAB_001a3136;
      }
      sqlite3_result_blob(ctx,p->aBlob,p->nBlob,sqlite3OomClear);
      p->nBlobAlloc = 0;
    }
    if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
      return;
    }
  }
  else if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    sqlite3_result_error_nomem(ctx);
    return;
  }
LAB_001a3136:
  __stack_chk_fail();
}

Assistant:

static void jsonReturnParse(
  sqlite3_context *ctx,
  JsonParse *p
){
  int flgs;
  if( p->oom ){
    sqlite3_result_error_nomem(ctx);
    return;
  }
  flgs = SQLITE_PTR_TO_INT(sqlite3_user_data(ctx));
  if( flgs & JSON_BLOB ){
    if( p->nBlobAlloc>0 && !p->bReadOnly ){
      sqlite3_result_blob(ctx, p->aBlob, p->nBlob, SQLITE_DYNAMIC);
      p->nBlobAlloc = 0;
    }else{
      sqlite3_result_blob(ctx, p->aBlob, p->nBlob, SQLITE_TRANSIENT);
    }
  }else{
    JsonString s;
    jsonStringInit(&s, ctx);
    p->delta = 0;
    jsonTranslateBlobToText(p, 0, &s);
    jsonReturnString(&s, p, ctx);
    sqlite3_result_subtype(ctx, JSON_SUBTYPE);
  }
}